

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O2

bool __thiscall ZXing::OneD::Raw2TxtDecoder::decode(Raw2TxtDecoder *this,int code)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_register_00000034;
  string sStack_38;
  
  this->lastTxtSize = (this->txt)._M_string_length;
  iVar2 = this->codeSet;
  if (iVar2 == 99) {
    if (code < 100) {
      ToString<int,void>(&sStack_38,(ZXing *)CONCAT44(in_register_00000034,code),2,in_ECX);
      std::__cxx11::string::append((string *)&this->txt);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    else if (code == 0x66) {
      fnc1(this,true);
    }
    else {
      this->codeSet = code;
    }
  }
  else {
    bVar1 = this->shift;
    switch(code) {
    case 0x60:
      this->_readerInit = true;
      break;
    case 0x61:
      break;
    case 0x62:
      if (bVar1 == false) {
        this->shift = true;
        this->codeSet = iVar2 == 0x65 ^ 0x65;
        return true;
      }
      return false;
    case 99:
      this->codeSet = 99;
      break;
    case 100:
    case 0x65:
      if (iVar2 == code) {
        if (this->fnc4Next == true) {
          this->fnc4All = (bool)(this->fnc4All ^ 1);
        }
        this->fnc4Next = (bool)(this->fnc4Next ^ 1);
      }
      else {
        this->codeSet = code;
      }
      break;
    case 0x66:
      fnc1(this,false);
      break;
    default:
      std::__cxx11::string::push_back((char)&this->txt);
      this->fnc4Next = false;
    }
    if (bVar1 != false) {
      this->codeSet = this->codeSet == 0x65 ^ 0x65;
      this->shift = false;
    }
  }
  return true;
}

Assistant:

bool decode(int code)
	{
		lastTxtSize = txt.size();

		if (codeSet == CODE_CODE_C) {
			if (code < 100) {
				txt.append(ToString(code, 2));
			} else if (code == CODE_FNC_1) {
				fnc1(true /*isCodeSetC*/);
			} else {
				codeSet = code; // CODE_A / CODE_B
			}
		} else { // codeSet A or B
			bool unshift = shift;

			switch (code) {
			case CODE_FNC_1: fnc1(false /*isCodeSetC*/); break;
			case CODE_FNC_2:
				// Message Append - do nothing?
				break;
			case CODE_FNC_3:
				_readerInit = true; // Can occur anywhere in the symbol (ISO/IEC 15417:2007 4.3.4.2 (c))
				break;
			case CODE_SHIFT:
				if (shift)
					return false; // two shifts in a row make no sense
				shift = true;
				codeSet = codeSet == CODE_CODE_A ? CODE_CODE_B : CODE_CODE_A;
				break;
			case CODE_CODE_A:
			case CODE_CODE_B:
				if (codeSet == code) {
					// FNC4
					if (fnc4Next)
						fnc4All = !fnc4All;
					fnc4Next = !fnc4Next;
				} else {
					codeSet = code;
				}
				break;
			case CODE_CODE_C: codeSet = CODE_CODE_C; break;

			default: {
				// code < 96 at this point
				int offset;
				if (codeSet == CODE_CODE_A && code >= 64)
					offset = fnc4All == fnc4Next ? -64 : +64;
				else
					offset = fnc4All == fnc4Next ? ' ' : ' ' + 128;
				txt.push_back((char)(code + offset));
				fnc4Next = false;
				break;
			}
			}

			// Unshift back to another code set if we were shifted
			if (unshift) {
				codeSet = codeSet == CODE_CODE_A ? CODE_CODE_B : CODE_CODE_A;
				shift = false;
			}
		}

		return true;
	}